

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
          (string *__return_storage_ptr__,XmlUnitTestResultPrinter *this,TestResult *result)

{
  int iVar1;
  TestProperty *this_00;
  Message *pMVar2;
  char *__s;
  long in_FS_OFFSET;
  TestProperty *property;
  int i;
  TestResult *result_local;
  allocator<char> local_61;
  char *local_60;
  Message local_58;
  Message attributes;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  Message::Message(&local_58);
  property._4_4_ = 0;
  while( true ) {
    iVar1 = TestResult::test_property_count((TestResult *)this);
    if (iVar1 <= property._4_4_) break;
    this_00 = TestResult::GetTestProperty((TestResult *)this,property._4_4_);
    pMVar2 = Message::operator<<(&local_58,(char (*) [2])0x1ea514);
    local_60 = TestProperty::key(this_00);
    pMVar2 = Message::operator<<(pMVar2,&local_60);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x1e8442);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x1eaf25);
    __s = TestProperty::value(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&attributes,__s,&local_61);
    EscapeXmlAttribute(&local_30,(string *)&attributes);
    pMVar2 = Message::operator<<(pMVar2,&local_30);
    Message::operator<<(pMVar2,(char (*) [2])0x1eaf25);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&attributes);
    std::allocator<char>::~allocator(&local_61);
    property._4_4_ = property._4_4_ + 1;
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,&local_58);
  Message::~Message(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}